

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_tracker_connection.cpp
# Opt level: O1

void __thiscall libtorrent::aux::udp_tracker_connection::start(udp_tracker_connection *this)

{
  mutex *pmVar1;
  event_t eVar2;
  uint uVar3;
  int read_timeout;
  session_settings *psVar4;
  ulong uVar5;
  undefined1 auVar6 [8];
  element_type *peVar7;
  int iVar8;
  _Head_base<3UL,_int,_false> _Var9;
  error_code *in_R8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  string_view url;
  string hostname;
  string protocol;
  shared_ptr<libtorrent::aux::request_callback> cb;
  error_code ec;
  undefined1 *local_140;
  undefined8 local_138;
  undefined1 local_130;
  undefined7 uStack_12f;
  undefined1 *local_120;
  undefined8 local_118;
  undefined1 local_110;
  undefined7 uStack_10f;
  resolver_interface *local_100;
  undefined1 local_f8 [8];
  element_type *peStack_f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8;
  _Head_base<3UL,_int,_false> local_d8;
  _Alloc_hider local_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c0;
  _Alloc_hider local_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  _Alloc_hider local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  target_fns *local_68;
  prop_fns<boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  *ppStack_60;
  code *local_58;
  _Alloc_hider _Stack_50;
  undefined1 local_40 [16];
  
  local_140 = &local_130;
  local_138 = 0;
  local_130 = 0;
  local_120 = &local_110;
  local_118 = 0;
  local_110 = 0;
  local_40._0_4_ = 0;
  local_40[4] = false;
  local_40._8_8_ = &boost::system::detail::cat_holder<void>::system_category_instance;
  url._M_str = local_40;
  url._M_len = (size_t)(this->super_tracker_connection).m_req.url._M_dataplus._M_p;
  parse_url_components_abi_cxx11_
            ((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_f8,(aux *)(this->super_tracker_connection).m_req.url._M_string_length,url,
             in_R8);
  ::std::__cxx11::string::operator=((string *)&local_120,(string *)&local_90);
  ::std::__cxx11::string::operator=((string *)&local_140,(string *)&local_d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_p != &local_80) {
    operator_delete(local_90._M_p,local_80._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_p != &local_a0) {
    operator_delete(local_b0._M_p,local_a0._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_p != &local_c0) {
    operator_delete(local_d0._M_p,local_c0._M_allocated_capacity + 1);
  }
  if (local_f8 != (undefined1  [8])&local_e8) {
    operator_delete((void *)local_f8,local_e8._M_allocated_capacity + 1);
  }
  _Var9._M_head_impl = local_d8._M_head_impl;
  if (local_d8._M_head_impl == -1) {
    iVar8 = ::std::__cxx11::string::compare((char *)&local_120);
    _Var9._M_head_impl = 0x1bb;
    if (iVar8 == 0) {
      _Var9._M_head_impl = 0x50;
    }
  }
  if ((bool)local_40[4] == true) {
    tracker_connection::fail
              (&this->super_tracker_connection,(error_code *)local_40,parse_address,"",
               (seconds32)0x0,(seconds32)0x0);
  }
  else {
    psVar4 = ((this->super_tracker_connection).m_man)->m_settings;
    pmVar1 = &psVar4->m_mutex;
    peStack_f0 = (element_type *)((ulong)peStack_f0 & 0xffffffffffffff00);
    local_f8 = (undefined1  [8])pmVar1;
    ::std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_f8);
    peStack_f0._0_1_ = true;
    uVar3 = (psVar4->m_store).m_ints._M_elems[0x7b];
    ::std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_f8);
    peStack_f0._0_1_ = false;
    local_f8 = (undefined1  [8])pmVar1;
    ::std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_f8);
    peStack_f0 = (element_type *)CONCAT71(peStack_f0._1_7_,1);
    uVar5 = (psVar4->m_store).m_bools.super__Base_bitset<2UL>._M_w[1];
    ::std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_f8);
    if (((uVar3 & 0xfffffffe) == 2) && ((uVar5 & 1) != 0)) {
      ::std::__cxx11::string::_M_assign((string *)&this->m_hostname);
      (this->m_target).impl_.data_.v4.sin_port =
           (ushort)_Var9._M_head_impl << 8 | (ushort)_Var9._M_head_impl >> 8;
      start_announce(this);
    }
    else {
      local_100 = ((this->super_tracker_connection).m_man)->m_host_resolver;
      eVar2 = (this->super_tracker_connection).m_req.event;
      shared_from_this((udp_tracker_connection *)local_f8);
      peVar7 = peStack_f0;
      auVar6 = local_f8;
      local_f8 = (undefined1  [8])0x0;
      peStack_f0 = (element_type *)0x0;
      local_68 = (target_fns *)0x0;
      ppStack_60 = (prop_fns<boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                    *)0x0;
      local_58 = (code *)0x0;
      _Stack_50._M_p = (pointer)0x0;
      local_68 = (target_fns *)operator_new(0x28);
      local_68->target_type = name_lookup;
      local_68->equal = (_func_bool_any_executor_base_ptr_any_executor_base_ptr *)0x0;
      *(int *)&local_68->execute = _Var9._M_head_impl;
      local_68->blocking_execute = (_func_void_any_executor_base_ptr_function_view *)auVar6;
      local_68[1].target_type = (_func_type_info_ptr *)peVar7;
      _Stack_50._M_p =
           (pointer)::std::
                    _Function_handler<void_(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&),_std::_Bind<void_(libtorrent::aux::udp_tracker_connection::*(std::shared_ptr<libtorrent::aux::udp_tracker_connection>,_std::_Placeholder<1>,_std::_Placeholder<2>,_int))(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&,_int)>_>
                    ::_M_invoke;
      local_58 = ::std::
                 _Function_handler<void_(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&),_std::_Bind<void_(libtorrent::aux::udp_tracker_connection::*(std::shared_ptr<libtorrent::aux::udp_tracker_connection>,_std::_Placeholder<1>,_std::_Placeholder<2>,_int))(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&,_int)>_>
                 ::_M_manager;
      (**local_100->_vptr_resolver_interface)(local_100,&local_140,(ulong)(eVar2 == stopped | 2));
      if (local_58 != (code *)0x0) {
        (*local_58)(&local_68,&local_68,3);
      }
      if (peStack_f0 != (element_type *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peStack_f0);
      }
      tracker_connection::requester((tracker_connection *)local_f8);
      if (local_f8 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_f8 + 0x38))
                  (local_f8,"*** UDP_TRACKER [ initiating name lookup: \"%s\" ]",local_140);
      }
      if (peStack_f0 != (element_type *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peStack_f0);
      }
    }
    if ((this->super_tracker_connection).m_req.event == stopped) {
      peStack_f0 = (element_type *)((ulong)peStack_f0._1_7_ << 8);
      local_f8 = (undefined1  [8])pmVar1;
      ::std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_f8);
      iVar8 = (psVar4->m_store).m_ints._M_elems[2];
    }
    else {
      peStack_f0 = (element_type *)((ulong)peStack_f0._1_7_ << 8);
      local_f8 = (undefined1  [8])pmVar1;
      ::std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_f8);
      iVar8 = (psVar4->m_store).m_ints._M_elems[0];
    }
    peStack_f0._0_1_ = true;
    ::std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_f8);
    peStack_f0._0_1_ = false;
    local_f8 = (undefined1  [8])pmVar1;
    ::std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_f8);
    peStack_f0 = (element_type *)CONCAT71(peStack_f0._1_7_,1);
    read_timeout = (psVar4->m_store).m_ints._M_elems[1];
    ::std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_f8);
    timeout_handler::set_timeout((timeout_handler *)this,iVar8,read_timeout);
  }
  if (local_120 != &local_110) {
    operator_delete(local_120,CONCAT71(uStack_10f,local_110) + 1);
  }
  if (local_140 != &local_130) {
    operator_delete(local_140,CONCAT71(uStack_12f,local_130) + 1);
  }
  return;
}

Assistant:

void udp_tracker_connection::start()
	{
		// TODO: 2 support authentication here. tracker_req().auth
		std::string hostname;
		std::string protocol;
		int port;
		error_code ec;

		std::tie(protocol, std::ignore, hostname, port, std::ignore)
			= parse_url_components(tracker_req().url, ec);
		if (port == -1) port = protocol == "http" ? 80 : 443;

		if (ec)
		{
			tracker_connection::fail(ec, operation_t::parse_address);
			return;
		}

		aux::session_settings const& settings = m_man.settings();

		int const proxy_type = settings.get_int(settings_pack::proxy_type);

		if (settings.get_bool(settings_pack::proxy_hostnames)
			&& (proxy_type == settings_pack::socks5
				|| proxy_type == settings_pack::socks5_pw))
		{
			m_hostname = hostname;
			m_target.port(std::uint16_t(port));
			start_announce();
		}
		else
		{
			using namespace std::placeholders;
			ADD_OUTSTANDING_ASYNC("udp_tracker_connection::name_lookup");
			// when stopping, pass in the cache-only flag, because we
			// don't want to get stuck on DNS lookups when shutting down
			m_man.host_resolver().async_resolve(hostname
				, (tracker_req().event == event_t::stopped
					? aux::resolver_interface::cache_only : aux::resolver_flags{})
					| aux::resolver_interface::abort_on_shutdown
				, std::bind(&udp_tracker_connection::name_lookup
					, shared_from_this(), _1, _2, port));

#ifndef TORRENT_DISABLE_LOGGING
			std::shared_ptr<request_callback> cb = requester();
			if (cb) cb->debug_log("*** UDP_TRACKER [ initiating name lookup: \"%s\" ]"
				, hostname.c_str());
#endif
		}

		set_timeout(tracker_req().event == event_t::stopped
			? settings.get_int(settings_pack::stop_tracker_timeout)
			: settings.get_int(settings_pack::tracker_completion_timeout)
			, settings.get_int(settings_pack::tracker_receive_timeout));
	}